

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

__m128i skinnycleanm128(__m128i x,int *mask16)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  __m128i alVar7;
  __m128i compactmask;
  intptr_t popx2;
  __m128i pruned;
  __m128i shufmask;
  int mask2;
  int mask1;
  int mask;
  __m128i sataddplusone;
  __m128i ones;
  __m128i satadd;
  __m128i constant;
  int *mask16_local;
  __m128i x_local;
  ushort uVar4;
  
  auVar1 = vpinsrb_avx(ZEXT116(0xde),0xde,1);
  auVar1 = vpinsrb_avx(auVar1,0xde,2);
  auVar1 = vpinsrb_avx(auVar1,0xde,3);
  auVar1 = vpinsrb_avx(auVar1,0xde,4);
  auVar1 = vpinsrb_avx(auVar1,0xde,5);
  auVar1 = vpinsrb_avx(auVar1,0xde,6);
  auVar1 = vpinsrb_avx(auVar1,0xde,7);
  auVar1 = vpinsrb_avx(auVar1,0xde,8);
  auVar1 = vpinsrb_avx(auVar1,0xde,9);
  auVar1 = vpinsrb_avx(auVar1,0xde,10);
  auVar1 = vpinsrb_avx(auVar1,0xde,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xde,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xde,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xde,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xde,0xf);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar1 = vpaddusb_avx(auVar5,auVar1);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  auVar1 = vpaddb_avx(auVar1,auVar2);
  uVar3 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7;
  uVar4 = uVar3 | (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10
          | (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  *(uint *)x[0] = (uint)uVar4;
  mask2._0_1_ = (byte)uVar3;
  mask2._1_1_ = (byte)(uVar4 >> 8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = thintable_epi8[(int)(uint)(byte)mask2];
  auVar1._8_8_ = thintable_epi8[(int)(uint)mask2._1_1_];
  auVar1._0_8_ = thintable_epi8[(int)(uint)mask2._1_1_];
  auVar2 = vunpcklpd_avx(auVar6,auVar1);
  auVar1 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar1 = vpinsrd_avx(auVar1,0x8080808,2);
  auVar1 = vpinsrd_avx(auVar1,0x8080808,3);
  auVar1 = vpaddb_avx(auVar2,auVar1);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1 = vpshufb_avx(auVar2,auVar1);
  alVar7[0] = (undefined1 (*) [16])("" + (ulong)""[(int)(uint)(byte)mask2] * 8);
  vpshufb_avx(auVar1,*alVar7[0]);
  alVar7[1] = 0;
  return alVar7;
}

Assistant:

__m128i skinnycleanm128(__m128i x, int *mask16) {
  __m128i constant = _mm_set1_epi8((char)(0xFF - 0x21));
  __m128i satadd = _mm_adds_epu8(x,constant);// anything >=0x21 will sum to 0xFF, rest is just under
  __m128i ones = _mm_set1_epi8(1);
  __m128i sataddplusone = _mm_add_epi8(satadd,ones);// 0xFF + 1 = 0
  int mask =  _mm_movemask_epi8(sataddplusone);
  *mask16 = mask;
  int mask1 = mask & 0xFF;
  int mask2 = (mask >> 8) & 0xFF;
  __m128i shufmask = _mm_castps_si128(_mm_loadh_pi(
        _mm_castsi128_ps(
          _mm_loadl_epi64((const __m128i *)(thintable_epi8 + mask1))
        ),
        (const __m64 *)(thintable_epi8 + mask2)
  ));
  shufmask = _mm_add_epi8(shufmask, _mm_set_epi32(0x08080808, 0x08080808, 0, 0));
  __m128i pruned = _mm_shuffle_epi8(x, shufmask);
  intptr_t popx2 = BitsSetTable256mul2[mask1];
  __m128i compactmask = _mm_loadu_si128((const __m128i*)(pshufb_combine_table + popx2*8));
  return _mm_shuffle_epi8(pruned, compactmask);
}